

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O3

void gen_VMLS_sp(TCGContext_conflict1 *tcg_ctx,TCGv_i32 vd,TCGv_i32 vn,TCGv_i32 vm,TCGv_ptr fpst)

{
  TCGTemp *ret;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *args [1];
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_ptr local_38;
  
  ret = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  local_48 = (TCGTemp *)(vn + (long)tcg_ctx);
  local_40 = (TCGTemp *)(vm + (long)tcg_ctx);
  local_38 = fpst + (long)tcg_ctx;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_muls_aarch64,ret,3,&local_48);
  local_48 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_negs_aarch64,ret,1,&local_48);
  local_48 = (TCGTemp *)(vd + (long)tcg_ctx);
  local_40 = ret;
  local_38 = fpst + (long)tcg_ctx;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_adds_aarch64,local_48,3,&local_48);
  tcg_temp_free_internal_aarch64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_VMLS_sp(TCGContext *tcg_ctx, TCGv_i32 vd, TCGv_i32 vn, TCGv_i32 vm, TCGv_ptr fpst)
{
    /*
     * VMLS: vd = vd + -(vn * vm)
     * Note that order of inputs to the add matters for NaNs.
     */
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);

    gen_helper_vfp_muls(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_negs(tcg_ctx, tmp, tmp);
    gen_helper_vfp_adds(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
}